

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soundexFuzz.cpp
# Opt level: O0

void __thiscall SoundexFuzz_RandomizeAll_Test::TestBody(SoundexFuzz_RandomizeAll_Test *this)

{
  int iVar1;
  time_t tVar2;
  AssertHelper local_80;
  Message local_78;
  string local_70 [32];
  uint local_50;
  int i_1;
  allocator local_39;
  string local_38 [8];
  string word;
  uint numChars;
  int i;
  SoundexFuzz_RandomizeAll_Test *this_local;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  for (word.field_2._12_4_ = 0; (int)word.field_2._12_4_ < 100000;
      word.field_2._12_4_ = word.field_2._12_4_ + 1) {
    iVar1 = rand();
    word.field_2._8_4_ = iVar1 % 6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    for (local_50 = 0; local_50 < (uint)word.field_2._8_4_; local_50 = local_50 + 1) {
      iVar1 = rand();
      std::__cxx11::string::operator+=(local_38,(char)iVar1);
    }
    Soundex::encode(local_70);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_38);
  }
  testing::Message::Message(&local_78);
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kSuccess,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kazz47[P]soundex/test/soundexFuzz.cpp"
             ,0x18,"Succeeded");
  testing::internal::AssertHelper::operator=(&local_80,&local_78);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  testing::Message::~Message(&local_78);
  return;
}

Assistant:

TEST(SoundexFuzz, RandomizeAll) {
    srand(time(NULL));

    for (int i = 0; i < 100000; i++) {
        unsigned int numChars = rand() % (int)(1.5 * Soundex::ENCODING_SIZE);

        string word = "";
        for (int i = 0; i < numChars; i++) {
            word += rand() % 256;
        }

        Soundex::encode(word);
    }

    SUCCEED();
}